

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stackless.hpp
# Opt level: O0

void __thiscall
stackless::microthreading::MicrothreadManager<implementations::scheme::SchemeImplementation>::
remove_thread(MicrothreadManager<implementations::scheme::SchemeImplementation> *this,
             ThreadId thread_ref)

{
  _threads_iterator thread_00;
  _threads_iterator thread;
  ThreadId thread_ref_local;
  MicrothreadManager<implementations::scheme::SchemeImplementation> *this_local;
  
  thread_00 = getThread(this,thread_ref);
  thread_remove_scheduling(this,thread_00);
  std::
  map<unsigned_int,stackless::microthreading::Microthread<implementations::scheme::SchemeImplementation>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,stackless::microthreading::Microthread<implementations::scheme::SchemeImplementation>>>>
  ::erase_abi_cxx11_((map<unsigned_int,stackless::microthreading::Microthread<implementations::scheme::SchemeImplementation>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,stackless::microthreading::Microthread<implementations::scheme::SchemeImplementation>>>>
                      *)&this->threads,(iterator)thread_00._M_node);
  return;
}

Assistant:

void remove_thread(const ThreadId thread_ref) {
				auto thread = getThread(thread_ref);
				thread_remove_scheduling(thread);
				threads.erase(thread);
			}